

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhugeint.cpp
# Opt level: O3

uhugeint_t __thiscall duckdb::uhugeint_t::operator<<(uhugeint_t *this,uhugeint_t *rhs)

{
  ulong uVar1;
  byte bVar2;
  uhugeint_t uVar3;
  uhugeint_t local_18;
  
  uVar1 = rhs->lower;
  if (uVar1 < 0x80 && rhs->upper == 0) {
    if (uVar1 == 0x40) {
      local_18.upper = this->lower;
      local_18.lower = 0;
    }
    else if (uVar1 == 0) {
      local_18.lower = this->lower;
      local_18.upper = this->upper;
    }
    else {
      bVar2 = (byte)uVar1;
      if (uVar1 < 0x40) {
        local_18.lower = this->lower << (bVar2 & 0x3f);
        local_18.upper = (this->lower >> (-bVar2 & 0x3f)) + (this->upper << (bVar2 & 0x3f));
      }
      else {
        local_18.upper = this->lower << (bVar2 & 0x3f);
        local_18.lower = 0;
      }
    }
  }
  else {
    uhugeint_t(&local_18,0);
  }
  uVar3.upper = local_18.upper;
  uVar3.lower = local_18.lower;
  return uVar3;
}

Assistant:

uhugeint_t uhugeint_t::operator<<(const uhugeint_t &rhs) const {
	const uint64_t shift = rhs.lower;
	if (rhs.upper != 0 || shift >= 128) {
		return uhugeint_t(0);
	} else if (shift == 0) {
		return *this;
	} else if (shift == 64) {
		return uhugeint_t(lower, 0);
	} else if (shift < 64) {
		return uhugeint_t((upper << shift) + (lower >> (64 - shift)), lower << shift);
	} else if ((128 > shift) && (shift > 64)) {
		return uhugeint_t(lower << (shift - 64), 0);
	}
	return uhugeint_t(0);
}